

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O0

int * __thiscall CP::queue<int>::front(queue<int> *this)

{
  size_t sVar1;
  out_of_range *this_00;
  queue<int> *this_local;
  
  sVar1 = size(this);
  if (sVar1 == 0) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    std::out_of_range::out_of_range(this_00,"index of out range");
    __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
  }
  return this->mData + this->mFront;
}

Assistant:

const T& front() const {
      if (size() == 0) throw std::out_of_range("index of out range") ;
      return mData[mFront];
    }